

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

void __thiscall
cmInstalledFile::AppendProperty
          (cmInstalledFile *this,cmMakefile *mf,string *prop,char *value,bool param_4)

{
  mapped_type *this_00;
  cmGeneratorExpression local_90;
  cmCompiledGeneratorExpression *local_88;
  mapped_type *local_80;
  Property *property;
  cmGeneratorExpression local_68;
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  bool param_4_local;
  char *value_local;
  string *prop_local;
  cmMakefile *mf_local;
  cmInstalledFile *this_local;
  
  cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge,mf);
  cmGeneratorExpression::cmGeneratorExpression(&local_68,(cmListFileBacktrace *)&ge);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
            ::operator[](&this->Properties,prop);
  local_80 = this_00;
  cmGeneratorExpression::Parse(&local_90,(char *)&local_68);
  local_88 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::release
                       ((auto_ptr<cmCompiledGeneratorExpression> *)&local_90);
  std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>::
  push_back(&this_00->ValueExpressions,&local_88);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_90);
  cmGeneratorExpression::~cmGeneratorExpression(&local_68);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge);
  return;
}

Assistant:

void cmInstalledFile::AppendProperty(cmMakefile const* mf,
  const std::string& prop, const char* value, bool /*asString*/)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(&backtrace);

  Property& property = this->Properties[prop];
  property.ValueExpressions.push_back(ge.Parse(value).release());
}